

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

VP8StatusCode ParsePartitions(VP8Decoder *dec,uint8_t *buf,size_t size)

{
  uint32_t uVar1;
  VP8StatusCode VVar2;
  uint uVar3;
  ulong size_00;
  VP8BitReader *br;
  ulong size_01;
  uint8_t *start;
  long lVar5;
  ulong uVar4;
  
  uVar1 = VP8GetValue(&dec->br_,2);
  uVar3 = ~(-1 << ((byte)uVar1 & 0x1f));
  uVar4 = (ulong)uVar3;
  dec->num_parts_minus_one_ = uVar3;
  VVar2 = VP8_STATUS_NOT_ENOUGH_DATA;
  size_01 = size + uVar4 * -3;
  if (uVar4 * 3 <= size) {
    start = buf + uVar4 * 3;
    if (uVar1 != 0) {
      br = dec->parts_;
      lVar5 = 0;
      do {
        size_00 = (ulong)CONCAT12(buf[lVar5 + 2],*(undefined2 *)(buf + lVar5));
        if (size_01 <= CONCAT12(buf[lVar5 + 2],*(undefined2 *)(buf + lVar5))) {
          size_00 = size_01;
        }
        VP8InitBitReader(br,start,size_00);
        start = start + size_00;
        size_01 = size_01 - size_00;
        lVar5 = lVar5 + 3;
        br = br + 1;
      } while ((uVar4 + (uVar4 == 0)) * 3 != lVar5);
    }
    VP8InitBitReader(dec->parts_ + uVar4,start,size_01);
    VVar2 = (uint)(buf + size <= start) * 5;
  }
  return VVar2;
}

Assistant:

static VP8StatusCode ParsePartitions(VP8Decoder* const dec,
                                     const uint8_t* buf, size_t size) {
  VP8BitReader* const br = &dec->br_;
  const uint8_t* sz = buf;
  const uint8_t* buf_end = buf + size;
  const uint8_t* part_start;
  size_t size_left = size;
  size_t last_part;
  size_t p;

  dec->num_parts_minus_one_ = (1 << VP8GetValue(br, 2, "global-header")) - 1;
  last_part = dec->num_parts_minus_one_;
  if (size < 3 * last_part) {
    // we can't even read the sizes with sz[]! That's a failure.
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  part_start = buf + last_part * 3;
  size_left -= last_part * 3;
  for (p = 0; p < last_part; ++p) {
    size_t psize = sz[0] | (sz[1] << 8) | (sz[2] << 16);
    if (psize > size_left) psize = size_left;
    VP8InitBitReader(dec->parts_ + p, part_start, psize);
    part_start += psize;
    size_left -= psize;
    sz += 3;
  }
  VP8InitBitReader(dec->parts_ + last_part, part_start, size_left);
  return (part_start < buf_end) ? VP8_STATUS_OK :
           VP8_STATUS_SUSPENDED;   // Init is ok, but there's not enough data
}